

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

int __thiscall cashew::JSPrinter::getPrecedence(JSPrinter *this,Ref node,bool parent)

{
  Type TVar1;
  Value *pVVar2;
  bool bVar3;
  int iVar4;
  Ref *pRVar5;
  undefined7 extraout_var;
  char *pcVar6;
  Type type_00;
  OperatorClass *this_00;
  IString op;
  IString op_00;
  Ref local_20;
  Ref node_local;
  Ref type;
  char *pcVar7;
  
  TVar1 = (node.inst)->type;
  pcVar6 = (char *)(ulong)TVar1;
  local_20.inst = node.inst;
  if (TVar1 - Assign_ < 2) {
    op.str._M_str._0_4_ = TVar1;
    op.str._M_len = DAT_010d1a30;
    op.str._M_str._4_4_ = 0;
    iVar4 = OperatorClass::getPrecedence((OperatorClass *)0x0,(Type)SET,op);
    return iVar4;
  }
  if (TVar1 != Array) {
    return -1;
  }
  pRVar5 = Ref::operator[](&local_20,0);
  node_local.inst = pRVar5->inst;
  bVar3 = Ref::operator==(&node_local,(IString *)&BINARY);
  if ((bVar3) || (bVar3 = Ref::operator==(&node_local,(IString *)&UNARY_PREFIX), bVar3)) {
    bVar3 = Ref::operator==(&node_local,(IString *)&BINARY);
    pRVar5 = Ref::operator[](&local_20,1);
    pVVar2 = pRVar5->inst;
    if (pVVar2->type != String) {
      __assert_fail("isString()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                    ,0xef,"IString &cashew::Value::getIString()");
    }
    this_00 = (OperatorClass *)(ulong)!bVar3;
    type_00 = (Type)(pVVar2->field_1).str.str._M_len;
    pcVar7 = (pVVar2->field_1).str.str._M_str;
  }
  else {
    bVar3 = Ref::operator==(&node_local,(IString *)&SEQ);
    if (!bVar3) {
      bVar3 = Ref::operator==(&node_local,(IString *)&CALL);
      if (!bVar3) {
        bVar3 = Ref::operator==(&node_local,(IString *)&CONDITIONAL);
        pcVar6 = (char *)(CONCAT71(extraout_var,bVar3) & 0xffffffff);
        if ((char)pcVar6 == '\0') {
          return -1;
        }
        type_00 = (Type)QUESTION;
        this_00 = (OperatorClass *)0x3;
        pcVar7 = DAT_010d1990;
        goto LAB_00d239b1;
      }
      if (!parent) {
        return -1;
      }
    }
    type_00 = (Type)COMMA;
    this_00 = (OperatorClass *)0x0;
    pcVar7 = DAT_010d1980;
  }
LAB_00d239b1:
  op_00.str._M_str = pcVar6;
  op_00.str._M_len = (size_t)pcVar7;
  iVar4 = OperatorClass::getPrecedence(this_00,type_00,op_00);
  return iVar4;
}

Assistant:

int getPrecedence(Ref node, bool parent) {
    if (node->isAssign() || node->isAssignName()) {
      return OperatorClass::getPrecedence(OperatorClass::Binary, SET);
    }
    if (!node->isArray()) {
      // node is a value
      return -1;
    }
    Ref type = node[0];
    if (type == BINARY || type == UNARY_PREFIX) {
      return OperatorClass::getPrecedence(
        type == BINARY ? OperatorClass::Binary : OperatorClass::Prefix,
        node[1]->getIString());
    } else if (type == SEQ) {
      return OperatorClass::getPrecedence(OperatorClass::Binary, COMMA);
    } else if (type == CALL) {
      // call arguments are split by commas, but call itself is safe
      return parent ? OperatorClass::getPrecedence(OperatorClass::Binary, COMMA)
                    : -1;
    } else if (type == CONDITIONAL) {
      return OperatorClass::getPrecedence(OperatorClass::Tertiary, QUESTION);
    }
    // otherwise, this is something that fixes precedence explicitly, and we can
    // ignore
    return -1; // XXX
  }